

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::NavCalcPreferredRefPos(void)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *g;
  ImVec2 IVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  float fVar9;
  
  if (((GImGui->NavDisableHighlight == false) && (GImGui->NavDisableMouseHover == true)) &&
     (pIVar2 = GImGui->NavWindow, pIVar2 != (ImGuiWindow *)0x0)) {
    auVar4._0_4_ = (GImGui->Style).FramePadding.x * 4.0;
    IVar3 = pIVar2->NavRectRel[GImGui->NavLayer].Min;
    IVar1 = pIVar2->NavRectRel[GImGui->NavLayer].Max;
    fVar9 = IVar1.y;
    fVar7 = IVar3.x;
    auVar4._4_4_ = (GImGui->Style).FramePadding.y;
    auVar4._8_8_ = 0;
    auVar5._4_4_ = fVar9 - IVar3.y;
    auVar5._0_4_ = IVar1.x - fVar7;
    auVar5._8_8_ = 0;
    auVar5 = minps(auVar4,auVar5);
    auVar6._0_4_ = (pIVar2->Pos).x + fVar7 + auVar5._0_4_;
    auVar6._4_4_ = (pIVar2->Pos).y + (fVar9 - auVar5._4_4_);
    auVar6._8_4_ = auVar5._8_4_ + 0.0 + 0.0;
    auVar6._12_4_ = auVar5._12_4_ + 0.0 + 0.0;
    auVar8._8_8_ = 0;
    auVar8._0_4_ = (GImGui->IO).DisplaySize.x;
    auVar8._4_4_ = (GImGui->IO).DisplaySize.y;
    auVar5 = minps(auVar8,auVar6);
    IVar3.x = (float)(int)(float)(-(uint)(0.0 <= auVar6._0_4_) & auVar5._0_4_);
    IVar3.y = (float)(int)(float)(-(uint)(0.0 <= auVar6._4_4_) & auVar5._4_4_);
    return IVar3;
  }
  if ((-256000.0 <= (GImGui->IO).MousePos.x) && (-256000.0 <= (GImGui->IO).MousePos.y)) {
    return (GImGui->IO).MousePos;
  }
  return GImGui->LastValidMousePos;
}

Assistant:

static ImVec2 ImGui::NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !g.NavWindow)
    {
        // Mouse (we need a fallback in case the mouse becomes invalid after being used)
        if (IsMousePosValid(&g.IO.MousePos))
            return g.IO.MousePos;
        return g.LastValidMousePos;
    }
    else
    {
        // When navigation is active and mouse is disabled, decide on an arbitrary position around the bottom left of the currently navigated item.
        const ImRect& rect_rel = g.NavWindow->NavRectRel[g.NavLayer];
        ImVec2 pos = g.NavWindow->Pos + ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x * 4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
        ImRect visible_rect = GetViewportRect();
        return ImFloor(ImClamp(pos, visible_rect.Min, visible_rect.Max));   // ImFloor() is important because non-integer mouse position application in backend might be lossy and result in undesirable non-zero delta.
    }
}